

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmlookup.cpp
# Opt level: O0

void __thiscall vm_lookup_ext::copy_ext_from(vm_lookup_ext *this,vm_lookup_ext *old_ext)

{
  undefined4 uVar1;
  vm_lookup_val *pvVar2;
  vm_lookup_val *pvVar3;
  vm_lookup_ext *in_RSI;
  vm_lookup_ext *in_RDI;
  uint i;
  char *newbase;
  char *oldbase;
  vm_lookup_val *newval;
  vm_lookup_val *oldval;
  vm_lookup_val **newbp;
  vm_lookup_val **oldbp;
  vm_lookup_val *local_60;
  vm_lookup_val *local_58;
  uint local_44;
  vm_lookup_val *local_30;
  vm_lookup_val *local_28;
  vm_lookup_val **local_20;
  vm_lookup_val **local_18;
  
  uVar1 = *(undefined4 *)&(in_RSI->default_value).field_0x4;
  (in_RDI->default_value).typ = (in_RSI->default_value).typ;
  *(undefined4 *)&(in_RDI->default_value).field_0x4 = uVar1;
  (in_RDI->default_value).val = (in_RSI->default_value).val;
  pvVar2 = idx_to_val(in_RSI,0);
  pvVar3 = idx_to_val(in_RDI,0);
  local_18 = in_RSI->buckets;
  local_20 = in_RDI->buckets;
  for (local_44 = in_RSI->bucket_cnt; local_44 != 0; local_44 = local_44 - 1) {
    if (*local_18 == (vm_lookup_val *)0x0) {
      local_58 = (vm_lookup_val *)0x0;
    }
    else {
      local_58 = (vm_lookup_val *)(((long)*local_18 - (long)pvVar2) + (long)pvVar3);
    }
    *local_20 = local_58;
    local_20 = local_20 + 1;
    local_18 = local_18 + 1;
  }
  local_44 = in_RSI->value_cnt;
  local_28 = idx_to_val(in_RSI,0);
  local_30 = idx_to_val(in_RDI,0);
  for (; local_44 != 0; local_44 = local_44 - 1) {
    uVar1 = *(undefined4 *)&(local_28->key).field_0x4;
    (local_30->key).typ = (local_28->key).typ;
    *(undefined4 *)&(local_30->key).field_0x4 = uVar1;
    (local_30->key).val = (local_28->key).val;
    uVar1 = *(undefined4 *)&(local_28->val).field_0x4;
    (local_30->val).typ = (local_28->val).typ;
    *(undefined4 *)&(local_30->val).field_0x4 = uVar1;
    (local_30->val).val = (local_28->val).val;
    if (local_28->nxt == (vm_lookup_val *)0x0) {
      local_60 = (vm_lookup_val *)0x0;
    }
    else {
      local_60 = (vm_lookup_val *)(((long)local_28->nxt - (long)pvVar2) + (long)pvVar3);
    }
    local_30->nxt = local_60;
    local_28 = local_28 + 1;
    local_30 = local_30 + 1;
  }
  in_RDI->first_free = local_30;
  for (local_44 = in_RDI->value_cnt - in_RSI->value_cnt; local_44 != 0; local_44 = local_44 + -1) {
    local_30->nxt = local_30 + 1;
    vm_val_t::set_empty(&local_30->key);
    vm_val_t::set_empty(&local_30->val);
    local_30 = local_30 + 1;
  }
  local_30[-1].nxt = (vm_lookup_val *)0x0;
  return;
}

Assistant:

void vm_lookup_ext::copy_ext_from(vm_lookup_ext *old_ext)
{
    vm_lookup_val **oldbp;
    vm_lookup_val **newbp;
    vm_lookup_val *oldval;
    vm_lookup_val *newval;
    char *oldbase;
    char *newbase;
    uint i;

    /* the bucket counts must be the same in both extensions */
    assert(bucket_cnt == old_ext->bucket_cnt);

    /* we must have at least as many entries as the old one had */
    assert(value_cnt >= old_ext->value_cnt);

    /* copy the default value */
    default_value = old_ext->default_value;

    /* get the new and old base values for faster pointer arithmetic */
    oldbase = (char *)old_ext->idx_to_val(0);
    newbase = (char *)idx_to_val(0);

    /* copy the hash buckets from the old extension to the new extension */
    for (i = old_ext->bucket_cnt, oldbp = old_ext->buckets, newbp = buckets ;
         i != 0 ; --i, ++newbp, ++oldbp)
    {
        /* copy the bucket pointer, adjusting to our local pointer scheme */
        *newbp = (*oldbp == 0
                  ? 0
                  : (vm_lookup_val *)(((char *)*oldbp - oldbase) + newbase));
    }

    /* copy the values from the old extension to the new extension */
    for (i = old_ext->value_cnt, oldval = old_ext->idx_to_val(0),
         newval = idx_to_val(0) ;
         i != 0 ;
         --i, ++oldval, ++newval)
    {
        /* copy this entry */
        newval->key = oldval->key;
        newval->val = oldval->val;
        newval->nxt = (oldval->nxt == 0
                       ? 0
                       : (vm_lookup_val *)(((char *)oldval->nxt - oldbase)
                                           + newbase));
    }

    /* link all of the remaining free values into the free list */
    first_free = newval;
    for (i = value_cnt - old_ext->value_cnt ; i != 0 ; --i, ++newval)
    {
        /* link this value into the free list */
        newval->nxt = newval + 1;

        /* mark this free value as empty */
        newval->key.set_empty();
        newval->val.set_empty();
    }

    /* terminate the free list */
    (newval - 1)->nxt = 0;
}